

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

char * tabexpand(char *sbuf)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *__s;
  uint uVar4;
  char buf [256];
  char local_128 [264];
  
  __s = local_128;
  if (*sbuf == '\0') {
    return sbuf;
  }
  uVar4 = 0;
  pcVar3 = sbuf;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '\t') {
      memset(__s,0x20,(ulong)(8 - (uVar4 & 7)));
      uVar2 = (uint)(byte)((byte)uVar4 ^ 7);
      __s = __s + (uVar2 & 7);
      uVar4 = uVar4 + (uVar2 & 7);
    }
    else {
      if (cVar1 == '\0') {
        *__s = '\0';
        strcpy(sbuf,local_128);
        return sbuf;
      }
      *__s = cVar1;
    }
    uVar4 = uVar4 + 1;
    __s = __s + 1;
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

char *tabexpand(char *sbuf)	/* expand tabs into proper number of spaces */
{
    char buf[BUFSZ];
    char *bp, *s = sbuf;
    int idx;

    if (!*s) return sbuf;

    /* warning: no bounds checking performed */
    for (bp = buf, idx = 0; *s; s++)
	if (*s == '\t') {
	    do *bp++ = ' '; while (++idx % 8);
	} else {
	    *bp++ = *s;
	    idx++;
	}
    *bp = 0;
    return strcpy(sbuf, buf);
}